

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

void stbtt__rasterize_sorted_edges
               (stbtt__bitmap *result,stbtt__edge *e,int n,int vsubsample,int off_x,int off_y,
               void *userdata)

{
  float *__s;
  stbtt__active_edge *psVar1;
  float fVar2;
  stbtt__active_edge *z_2;
  int m;
  float k;
  float sum;
  stbtt__active_edge *z_1;
  stbtt__active_edge *z;
  stbtt__active_edge **step;
  float scan_y_bottom;
  float scan_y_top;
  float *scanline2;
  float *scanline;
  float scanline_data [129];
  int i;
  int j;
  int y;
  stbtt__active_edge *active;
  stbtt__hheap hh;
  int off_y_local;
  int off_x_local;
  int vsubsample_local;
  int n_local;
  stbtt__edge *e_local;
  stbtt__bitmap *result_local;
  
  hh.num_remaining_in_head_chunk = off_y;
  hh._20_4_ = off_x;
  memset(&active,0,0x18);
  _j = (stbtt__active_edge *)0x0;
  scanline_data[0x80] = 0.0;
  if (result->w < 0x41) {
    scanline2 = (float *)&scanline;
  }
  else {
    scanline2 = (float *)ImGui::MemAlloc((long)(result->w * 2 + 1) << 2);
  }
  __s = scanline2 + result->w;
  i = hh.num_remaining_in_head_chunk;
  e[n].y0 = (float)(hh.num_remaining_in_head_chunk + result->h) + 1.0;
  _vsubsample_local = e;
  do {
    if (result->h <= (int)scanline_data[0x80]) {
      stbtt__hheap_cleanup((stbtt__hheap *)&active,userdata);
      if ((float **)scanline2 != &scanline) {
        ImGui::MemFree(scanline2);
      }
      return;
    }
    fVar2 = (float)i + 0.0;
    z = (stbtt__active_edge *)&j;
    memset(scanline2,0,(long)result->w << 2);
    memset(__s,0,(long)(result->w + 1) << 2);
    while (z->next != (stbtt__active_edge *)0x0) {
      psVar1 = z->next;
      if (fVar2 < psVar1->ey) {
        z = z->next;
      }
      else {
        z->next = psVar1->next;
        if ((psVar1->direction == 0.0) && (!NAN(psVar1->direction))) {
          __assert_fail("z->direction",
                        "/workspace/llm4binary/github/license_c_cmakelists/Green-Sky[P]imgui_entt_entity_editor_demo/external/imgui/imstb_truetype.h"
                        ,0xc63,
                        "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                       );
        }
        psVar1->direction = 0.0;
        stbtt__hheap_free((stbtt__hheap *)&active,psVar1);
      }
    }
    for (; _vsubsample_local->y0 <= (float)i + 1.0; _vsubsample_local = _vsubsample_local + 1) {
      if (((_vsubsample_local->y0 != _vsubsample_local->y1) ||
          (NAN(_vsubsample_local->y0) || NAN(_vsubsample_local->y1))) &&
         (psVar1 = stbtt__new_active((stbtt__hheap *)&active,_vsubsample_local,hh._20_4_,fVar2,
                                     userdata), psVar1 != (stbtt__active_edge *)0x0)) {
        if (((scanline_data[0x80] == 0.0) && (hh.num_remaining_in_head_chunk != 0)) &&
           (psVar1->ey < fVar2)) {
          psVar1->ey = fVar2;
        }
        if (psVar1->ey < fVar2) {
          __assert_fail("z->ey >= scan_y_top",
                        "/workspace/llm4binary/github/license_c_cmakelists/Green-Sky[P]imgui_entt_entity_editor_demo/external/imgui/imstb_truetype.h"
                        ,0xc76,
                        "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                       );
        }
        psVar1->next = _j;
        _j = psVar1;
      }
    }
    if (_j != (stbtt__active_edge *)0x0) {
      stbtt__fill_active_edges_new(scanline2,__s + 1,result->w,_j,fVar2);
    }
    m = 0;
    for (scanline_data[0x7f] = 0.0; (int)scanline_data[0x7f] < result->w;
        scanline_data[0x7f] = (float)((int)scanline_data[0x7f] + 1)) {
      m = (int)(__s[(int)scanline_data[0x7f]] + (float)m);
      fVar2 = ImFabs(scanline2[(int)scanline_data[0x7f]] + (float)m);
      z_2._4_4_ = (int)(fVar2 * 255.0 + 0.5);
      if (0xff < z_2._4_4_) {
        z_2._4_4_ = 0xff;
      }
      result->pixels[(int)scanline_data[0x80] * result->stride + (int)scanline_data[0x7f]] =
           (uchar)z_2._4_4_;
    }
    for (z = (stbtt__active_edge *)&j; z->next != (stbtt__active_edge *)0x0; z = z->next) {
      psVar1 = z->next;
      psVar1->fx = psVar1->fdx + psVar1->fx;
    }
    i = i + 1;
    scanline_data[0x80] = (float)((int)scanline_data[0x80] + 1);
  } while( true );
}

Assistant:

static void stbtt__rasterize_sorted_edges(stbtt__bitmap *result, stbtt__edge *e, int n, int vsubsample, int off_x, int off_y, void *userdata)
{
   stbtt__hheap hh = { 0, 0, 0 };
   stbtt__active_edge *active = NULL;
   int y,j=0, i;
   float scanline_data[129], *scanline, *scanline2;

   STBTT__NOTUSED(vsubsample);

   if (result->w > 64)
      scanline = (float *) STBTT_malloc((result->w*2+1) * sizeof(float), userdata);
   else
      scanline = scanline_data;

   scanline2 = scanline + result->w;

   y = off_y;
   e[n].y0 = (float) (off_y + result->h) + 1;

   while (j < result->h) {
      // find center of pixel for this scanline
      float scan_y_top    = y + 0.0f;
      float scan_y_bottom = y + 1.0f;
      stbtt__active_edge **step = &active;

      STBTT_memset(scanline , 0, result->w*sizeof(scanline[0]));
      STBTT_memset(scanline2, 0, (result->w+1)*sizeof(scanline[0]));

      // update all active edges;
      // remove all active edges that terminate before the top of this scanline
      while (*step) {
         stbtt__active_edge * z = *step;
         if (z->ey <= scan_y_top) {
            *step = z->next; // delete from list
            STBTT_assert(z->direction);
            z->direction = 0;
            stbtt__hheap_free(&hh, z);
         } else {
            step = &((*step)->next); // advance through list
         }
      }

      // insert all edges that start before the bottom of this scanline
      while (e->y0 <= scan_y_bottom) {
         if (e->y0 != e->y1) {
            stbtt__active_edge *z = stbtt__new_active(&hh, e, off_x, scan_y_top, userdata);
            if (z != NULL) {
               if (j == 0 && off_y != 0) {
                  if (z->ey < scan_y_top) {
                     // this can happen due to subpixel positioning and some kind of fp rounding error i think
                     z->ey = scan_y_top;
                  }
               }
               STBTT_assert(z->ey >= scan_y_top); // if we get really unlucky a tiny bit of an edge can be out of bounds
               // insert at front
               z->next = active;
               active = z;
            }
         }
         ++e;
      }

      // now process all active edges
      if (active)
         stbtt__fill_active_edges_new(scanline, scanline2+1, result->w, active, scan_y_top);

      {
         float sum = 0;
         for (i=0; i < result->w; ++i) {
            float k;
            int m;
            sum += scanline2[i];
            k = scanline[i] + sum;
            k = (float) STBTT_fabs(k)*255 + 0.5f;
            m = (int) k;
            if (m > 255) m = 255;
            result->pixels[j*result->stride + i] = (unsigned char) m;
         }
      }
      // advance all the edges
      step = &active;
      while (*step) {
         stbtt__active_edge *z = *step;
         z->fx += z->fdx; // advance to position for current scanline
         step = &((*step)->next); // advance through list
      }

      ++y;
      ++j;
   }

   stbtt__hheap_cleanup(&hh, userdata);

   if (scanline != scanline_data)
      STBTT_free(scanline, userdata);
}